

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall
cppjieba::Trie::CreateTrie
          (Trie *this,
          vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
          *keys,vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                *valuePointers)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *in_RDX;
  vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
  *in_RSI;
  size_t i;
  DictUnit *in_stack_00000050;
  Unicode *in_stack_00000058;
  Trie *in_stack_00000060;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
  *in_stack_ffffffffffffffd0;
  ulong local_20;
  
  bVar1 = std::vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::
          empty(in_stack_ffffffffffffffd0);
  if ((!bVar1) &&
     (bVar1 = std::
              vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
              ::empty((vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
                       *)in_stack_ffffffffffffffd0), !bVar1)) {
    sVar2 = std::
            vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
            ::size(in_RSI);
    sVar3 = std::vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::
            size(in_RDX);
    if (sVar2 != sVar3) {
      __assert_fail("keys.size() == valuePointers.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/Trie.hpp"
                    ,0x96,
                    "void cppjieba::Trie::CreateTrie(const vector<Unicode> &, const vector<const DictUnit *> &)"
                   );
    }
    for (local_20 = 0;
        sVar2 = std::
                vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
                ::size(in_RSI), local_20 < sVar2; local_20 = local_20 + 1) {
      std::
      vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
      ::operator[](in_RSI,local_20);
      std::vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::
      operator[](in_RDX,local_20);
      InsertNode(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
  }
  return;
}

Assistant:

void CreateTrie(const vector<Unicode>& keys, const vector<const DictUnit*>& valuePointers) {
    if (valuePointers.empty() || keys.empty()) {
      return;
    }
    assert(keys.size() == valuePointers.size());

    for (size_t i = 0; i < keys.size(); i++) {
      InsertNode(keys[i], valuePointers[i]);
    }
  }